

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

double benchmark::ChildrenCPUUsage(void)

{
  int iVar1;
  double dVar2;
  rusage ru;
  rusage local_90;
  
  iVar1 = getrusage(RUSAGE_CHILDREN,&local_90);
  dVar2 = 0.0;
  if (iVar1 == 0) {
    dVar2 = (double)local_90.ru_stime.tv_usec * 1e-06 +
            (double)local_90.ru_stime.tv_sec +
            (double)local_90.ru_utime.tv_usec * 1e-06 + (double)local_90.ru_utime.tv_sec;
  }
  return dVar2;
}

Assistant:

double ChildrenCPUUsage() {
#ifndef BENCHMARK_OS_WINDOWS
  struct rusage ru;
  if (getrusage(RUSAGE_CHILDREN, &ru) == 0) {
    return (static_cast<double>(ru.ru_utime.tv_sec) +
            static_cast<double>(ru.ru_utime.tv_usec) * 1e-6 +
            static_cast<double>(ru.ru_stime.tv_sec) +
            static_cast<double>(ru.ru_stime.tv_usec) * 1e-6);
  } else {
    return 0.0;
  }
#else
  // TODO: Not sure what this even means on Windows
  return 0.0;
#endif  // OS_WINDOWS
}